

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O1

HighsInt __thiscall HighsSymmetryDetection::getOrbit(HighsSymmetryDetection *this,HighsInt vertex)

{
  int *piVar1;
  pointer piVar2;
  iterator __position;
  pointer piVar3;
  pointer piVar4;
  int iVar5;
  long lVar6;
  HighsInt i;
  int local_24;
  
  local_24 = (this->vertexPosition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[vertex];
  piVar2 = (this->orbitPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar5 = piVar2[local_24];
  lVar6 = (long)iVar5;
  if (iVar5 != piVar2[lVar6]) {
    do {
      __position._M_current =
           (this->linkCompressionStack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->linkCompressionStack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->linkCompressionStack,__position,
                   &local_24);
      }
      else {
        *__position._M_current = local_24;
        (this->linkCompressionStack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      local_24 = (int)lVar6;
      piVar2 = (this->orbitPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar5 = piVar2[local_24];
      lVar6 = (long)iVar5;
    } while (iVar5 != piVar2[lVar6]);
    piVar3 = (this->linkCompressionStack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (this->linkCompressionStack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    do {
      piVar1 = piVar4 + -1;
      piVar4 = piVar4 + -1;
      piVar2[*piVar1] = iVar5;
    } while (piVar4 != piVar3);
    (this->linkCompressionStack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar4;
  }
  return iVar5;
}

Assistant:

HighsInt HighsSymmetryDetection::getOrbit(HighsInt vertex) {
  HighsInt i = vertexPosition[vertex];
  HighsInt orbit = orbitPartition[i];
  if (orbit != orbitPartition[orbit]) {
    do {
      linkCompressionStack.push_back(i);
      i = orbit;
      orbit = orbitPartition[orbit];
    } while (orbit != orbitPartition[orbit]);

    do {
      i = linkCompressionStack.back();
      linkCompressionStack.pop_back();
      orbitPartition[i] = orbit;
    } while (!linkCompressionStack.empty());
  }

  return orbit;
}